

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,StringData *value)

{
  bool bVar1;
  undefined1 local_50 [8];
  StringData sdata;
  StringData *value_local;
  AsciiParser *this_local;
  
  if (value == (StringData *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    sdata._40_8_ = value;
    tinyusdz::value::StringData::StringData((StringData *)local_50);
    bVar1 = MaybeTripleQuotedString(this,(StringData *)local_50);
    if (bVar1) {
      tinyusdz::value::StringData::operator=((StringData *)sdata._40_8_,(StringData *)local_50);
      this_local._7_1_ = 1;
      bVar1 = true;
    }
    else {
      bVar1 = MaybeString(this,(StringData *)local_50);
      if (bVar1) {
        tinyusdz::value::StringData::operator=((StringData *)sdata._40_8_,(StringData *)local_50);
        this_local._7_1_ = 1;
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    }
    tinyusdz::value::StringData::~StringData((StringData *)local_50);
    if (!bVar1) {
      this_local._7_1_ = 0;
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::ReadBasicType(value::StringData *value) {
  if (!value) {
    return false;
  }

  // May be triple-quoted string
  {
    value::StringData sdata;
    if (MaybeTripleQuotedString(&sdata)) {
      (*value) = sdata;
      return true;

    } else if (MaybeString(&sdata)) {
      (*value) = sdata;
      return true;
    }
  }

  return false;
}